

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O2

QSize __thiscall QLineEdit::sizeHint(QLineEdit *this)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  long lVar5;
  QLineEditPrivate *this_00;
  int iVar6;
  int iVar7;
  QStyle *pQVar8;
  QSize QVar9;
  int iVar10;
  long in_FS_OFFSET;
  QMargins QVar11;
  int local_98;
  int local_94;
  QFontMetrics fm;
  QStyleOptionFrame opt;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  QWidget::ensurePolished(&this->super_QWidget);
  _fm = &DAT_aaaaaaaaaaaaaaaa;
  QFontMetrics::QFontMetrics(&fm,&((this->super_QWidget).data)->fnt);
  pQVar8 = QWidget::style(&this->super_QWidget);
  iVar6 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x3e,0,this);
  QVar11 = QLineEditPrivate::effectiveTextMargins(this_00);
  iVar7 = QFontMetrics::height();
  iVar10 = iVar6 + -2;
  if (iVar6 < 0x11) {
    iVar10 = 0xe;
  }
  if (iVar10 < iVar7) {
    iVar10 = iVar7;
  }
  sVar1 = (this_00->super_QWidgetPrivate).topmargin;
  sVar2 = (this_00->super_QWidgetPrivate).bottommargin;
  iVar6 = QFontMetrics::horizontalAdvance((QChar)(char16_t)&fm);
  sVar3 = (this_00->super_QWidgetPrivate).leftmargin;
  sVar4 = (this_00->super_QWidgetPrivate).rightmargin;
  opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionFrame::QStyleOptionFrame(&opt);
  (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,&opt);
  pQVar8 = QWidget::style(&this->super_QWidget);
  local_98 = QVar11.m_right.m_i.m_i + QVar11.m_left.m_i.m_i + iVar6 * 0x11 + 4 +
             (int)sVar4 + (int)sVar3;
  local_94 = (int)sVar2 + (int)sVar1 + QVar11.m_bottom.m_i.m_i + QVar11.m_top.m_i.m_i + iVar10 + 2;
  QVar9 = (QSize)(**(code **)(*(long *)pQVar8 + 0xe8))(pQVar8,0xe,&opt,&local_98,this);
  QStyleOption::~QStyleOption(&opt.super_QStyleOption);
  QFontMetrics::~QFontMetrics(&fm);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return QVar9;
  }
  __stack_chk_fail();
}

Assistant:

QSize QLineEdit::sizeHint() const
{
    Q_D(const QLineEdit);
    ensurePolished();
    QFontMetrics fm(font());
    const int iconSize = style()->pixelMetric(QStyle::PM_SmallIconSize, nullptr, this);
    const QMargins tm = d->effectiveTextMargins();
    int h = qMax(fm.height(), qMax(14, iconSize - 2)) + 2 * QLineEditPrivate::verticalMargin
            + tm.top() + tm.bottom()
            + d->topmargin + d->bottommargin;
    int w = fm.horizontalAdvance(u'x') * 17 + 2 * QLineEditPrivate::horizontalMargin
            + tm.left() + tm.right()
            + d->leftmargin + d->rightmargin; // "some"
    QStyleOptionFrame opt;
    initStyleOption(&opt);
    return style()->sizeFromContents(QStyle::CT_LineEdit, &opt, QSize(w, h), this);
}